

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuEvent>::moveAppend
          (QGenericArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,QDBusMenuEvent *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  QDBusMenuEvent *pQVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  if ((b != e) && (b < e)) {
    pQVar3 = (this->super_QArrayDataPointer<QDBusMenuEvent>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size;
      pQVar3[lVar4].m_id = b->m_id;
      pDVar5 = (b->m_eventId).d.d;
      (b->m_eventId).d.d = (Data *)0x0;
      pQVar3[lVar4].m_eventId.d.d = pDVar5;
      pcVar6 = (b->m_eventId).d.ptr;
      (b->m_eventId).d.ptr = (char16_t *)0x0;
      pQVar3[lVar4].m_eventId.d.ptr = pcVar6;
      qVar7 = (b->m_eventId).d.size;
      (b->m_eventId).d.size = 0;
      pQVar3[lVar4].m_eventId.d.size = qVar7;
      pPVar8 = (b->m_data).m_variant.d.data.shared;
      uVar9 = *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 8);
      uVar10 = *(undefined8 *)&(b->m_data).m_variant.d.field_0x18;
      puVar2 = (undefined8 *)((long)&pQVar3[lVar4].m_data.m_variant.d.data + 0x10);
      *puVar2 = *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 0x10);
      puVar2[1] = uVar10;
      pQVar3[lVar4].m_data.m_variant.d.data.shared = pPVar8;
      *(undefined8 *)((long)&pQVar3[lVar4].m_data.m_variant.d.data + 8) = uVar9;
      (b->m_data).m_variant.d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 8) = 0;
      *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 0x10) = 0;
      *(undefined8 *)&(b->m_data).m_variant.d.field_0x18 = 2;
      pQVar3[lVar4].m_timestamp = b->m_timestamp;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QDBusMenuEvent>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }